

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

iterator __thiscall
QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
          (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this)

{
  detach(this);
  return (iterator)((this->d).ptr + (this->d).size);
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }